

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.cpp
# Opt level: O0

ptr<Object> __thiscall Value::asObject(Value *this)

{
  ThrowPacket *this_00;
  allocator<char> local_49;
  string local_48;
  ptr<Value> local_28;
  Value *this_local;
  
  this_local = this;
  this_00 = (ThrowPacket *)__cxa_allocate_exception(0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"Could not cast value to Object",&local_49);
  ExceptionObjects::bad_cast((ExceptionObjects *)&local_28,&local_48);
  ThrowPacket::ThrowPacket(this_00,&local_28);
  __cxa_throw(this_00,&ThrowPacket::typeinfo,ThrowPacket::~ThrowPacket);
}

Assistant:

ptr<Object> Value::asObject() {
    throw ThrowPacket(ExceptionObjects::bad_cast("Could not cast value to Object"));
}